

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf256.cpp
# Opt level: O2

void gf256_addset_mem(void *vz,void *vx,void *vy,int bytes)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  ulong uVar35;
  __m128i *y16;
  long lVar36;
  __m128i *x16;
  __m128i *z16;
  long lVar37;
  
  if (CpuHasAVX2) {
    lVar36 = ((long)bytes / 0x20 & 0xffffffffU) << 5;
    for (lVar37 = 0; lVar36 != lVar37; lVar37 = lVar37 + 0x20) {
      puVar1 = (uint *)((long)vy + lVar37);
      uVar34 = puVar1[1];
      uVar5 = puVar1[2];
      uVar6 = puVar1[3];
      uVar7 = puVar1[4];
      uVar8 = puVar1[5];
      uVar9 = puVar1[6];
      uVar10 = puVar1[7];
      puVar2 = (uint *)((long)vx + lVar37);
      uVar11 = puVar2[1];
      uVar12 = puVar2[2];
      uVar13 = puVar2[3];
      uVar14 = puVar2[4];
      uVar15 = puVar2[5];
      uVar16 = puVar2[6];
      uVar17 = puVar2[7];
      puVar3 = (uint *)((long)vz + lVar37);
      *puVar3 = *puVar1 ^ *puVar2;
      puVar3[1] = uVar34 ^ uVar11;
      puVar3[2] = uVar5 ^ uVar12;
      puVar3[3] = uVar6 ^ uVar13;
      puVar3[4] = uVar7 ^ uVar14;
      puVar3[5] = uVar8 ^ uVar15;
      puVar3[6] = uVar9 ^ uVar16;
      puVar3[7] = uVar10 ^ uVar17;
    }
    iVar4 = (int)((long)bytes / 0x20) * -0x20;
  }
  else {
    lVar37 = 0x30;
    for (lVar36 = 0; iVar4 = (int)lVar36, 0x3f < bytes + iVar4; lVar36 = lVar36 + -0x40) {
      puVar2 = (uint *)((long)vy + lVar37 + -0x30);
      uVar34 = puVar2[1];
      uVar5 = puVar2[2];
      uVar6 = puVar2[3];
      puVar1 = (uint *)((long)vy + lVar37 + -0x20);
      uVar7 = *puVar1;
      uVar8 = puVar1[1];
      uVar9 = puVar1[2];
      uVar10 = puVar1[3];
      puVar1 = (uint *)((long)vy + lVar37 + -0x10);
      uVar11 = *puVar1;
      uVar12 = puVar1[1];
      uVar13 = puVar1[2];
      uVar14 = puVar1[3];
      puVar1 = (uint *)((long)vy + lVar37);
      uVar15 = *puVar1;
      uVar16 = puVar1[1];
      uVar17 = puVar1[2];
      uVar18 = puVar1[3];
      puVar3 = (uint *)((long)vx + lVar37 + -0x30);
      uVar19 = puVar3[1];
      uVar20 = puVar3[2];
      uVar21 = puVar3[3];
      puVar1 = (uint *)((long)vx + lVar37 + -0x20);
      uVar22 = *puVar1;
      uVar23 = puVar1[1];
      uVar24 = puVar1[2];
      uVar25 = puVar1[3];
      puVar1 = (uint *)((long)vx + lVar37 + -0x10);
      uVar26 = *puVar1;
      uVar27 = puVar1[1];
      uVar28 = puVar1[2];
      uVar29 = puVar1[3];
      puVar1 = (uint *)((long)vx + lVar37);
      uVar30 = *puVar1;
      uVar31 = puVar1[1];
      uVar32 = puVar1[2];
      uVar33 = puVar1[3];
      puVar1 = (uint *)((long)vz + lVar37 + -0x30);
      *puVar1 = *puVar2 ^ *puVar3;
      puVar1[1] = uVar34 ^ uVar19;
      puVar1[2] = uVar5 ^ uVar20;
      puVar1[3] = uVar6 ^ uVar21;
      puVar1 = (uint *)((long)vz + lVar37 + -0x20);
      *puVar1 = uVar7 ^ uVar22;
      puVar1[1] = uVar8 ^ uVar23;
      puVar1[2] = uVar9 ^ uVar24;
      puVar1[3] = uVar10 ^ uVar25;
      puVar1 = (uint *)((long)vz + lVar37 + -0x10);
      *puVar1 = uVar11 ^ uVar26;
      puVar1[1] = uVar12 ^ uVar27;
      puVar1[2] = uVar13 ^ uVar28;
      puVar1[3] = uVar14 ^ uVar29;
      puVar1 = (uint *)((long)vz + lVar37);
      *puVar1 = uVar15 ^ uVar30;
      puVar1[1] = uVar16 ^ uVar31;
      puVar1[2] = uVar17 ^ uVar32;
      puVar1[3] = uVar18 ^ uVar33;
      lVar37 = lVar37 + 0x40;
    }
    lVar36 = -lVar36;
  }
  lVar37 = 0;
  for (uVar34 = bytes + iVar4; 0xf < (int)uVar34; uVar34 = uVar34 - 0x10) {
    puVar1 = (uint *)((long)vy + lVar37 + lVar36);
    uVar5 = puVar1[1];
    uVar6 = puVar1[2];
    uVar7 = puVar1[3];
    puVar2 = (uint *)((long)vx + lVar37 + lVar36);
    uVar8 = puVar2[1];
    uVar9 = puVar2[2];
    uVar10 = puVar2[3];
    puVar3 = (uint *)((long)vz + lVar37 + lVar36);
    *puVar3 = *puVar1 ^ *puVar2;
    puVar3[1] = uVar5 ^ uVar8;
    puVar3[2] = uVar6 ^ uVar9;
    puVar3[3] = uVar7 ^ uVar10;
    lVar37 = lVar37 + 0x10;
  }
  if ((uVar34 & 8) != 0) {
    *(ulong *)((long)vz + lVar37 + lVar36) =
         *(ulong *)((long)vy + lVar37 + lVar36) ^ *(ulong *)((long)vx + lVar37 + lVar36);
  }
  if ((uVar34 & 4) != 0) {
    uVar35 = (ulong)(uVar34 & 8);
    *(uint *)((long)vz + lVar37 + uVar35 + lVar36) =
         *(uint *)((long)vy + lVar37 + uVar35 + lVar36) ^
         *(uint *)((long)vx + lVar37 + uVar35 + lVar36);
  }
  switch(uVar34 & 3) {
  case 0:
    return;
  case 3:
    uVar35 = (ulong)(uVar34 & 0xc);
    *(byte *)((long)vz + lVar37 + 2 + uVar35 + lVar36) =
         *(byte *)((long)vy + lVar37 + 2 + uVar35 + lVar36) ^
         *(byte *)((long)vx + lVar37 + 2 + uVar35 + lVar36);
  case 2:
    uVar35 = (ulong)(uVar34 & 0xc);
    *(byte *)((long)vz + lVar37 + 1 + uVar35 + lVar36) =
         *(byte *)((long)vy + lVar37 + 1 + uVar35 + lVar36) ^
         *(byte *)((long)vx + lVar37 + 1 + uVar35 + lVar36);
  case 1:
    uVar35 = (ulong)(uVar34 & 0xc);
    *(byte *)((long)vz + lVar37 + uVar35 + lVar36) =
         *(byte *)((long)vy + lVar37 + uVar35 + lVar36) ^
         *(byte *)((long)vx + lVar37 + uVar35 + lVar36);
    return;
  }
}

Assistant:

void gf256_addset_mem(void * GF256_RESTRICT vz, const void * GF256_RESTRICT vx,
                                 const void * GF256_RESTRICT vy, int bytes)
{
    GF256_M128 * GF256_RESTRICT z16 = reinterpret_cast<GF256_M128*>(vz);
    const GF256_M128 * GF256_RESTRICT x16 = reinterpret_cast<const GF256_M128*>(vx);
    const GF256_M128 * GF256_RESTRICT y16 = reinterpret_cast<const GF256_M128*>(vy);

#if defined(GF256_TARGET_MOBILE)
# if defined(GF256_TRY_NEON)
    // Handle multiples of 64 bytes
    if (CpuHasNeon)
    {
        while (bytes >= 64)
        {
            GF256_M128 x0 = vld1q_u8((uint8_t*)x16);
            GF256_M128 x1 = vld1q_u8((uint8_t*)(x16 + 1));
            GF256_M128 x2 = vld1q_u8((uint8_t*)(x16 + 2));
            GF256_M128 x3 = vld1q_u8((uint8_t*)(x16 + 3));
            GF256_M128 y0 = vld1q_u8((uint8_t*)(y16));
            GF256_M128 y1 = vld1q_u8((uint8_t*)(y16 + 1));
            GF256_M128 y2 = vld1q_u8((uint8_t*)(y16 + 2));
            GF256_M128 y3 = vld1q_u8((uint8_t*)(y16 + 3));

            vst1q_u8((uint8_t*)z16,     veorq_u8(x0, y0));
            vst1q_u8((uint8_t*)(z16 + 1), veorq_u8(x1, y1));
            vst1q_u8((uint8_t*)(z16 + 2), veorq_u8(x2, y2));
            vst1q_u8((uint8_t*)(z16 + 3), veorq_u8(x3, y3));

            bytes -= 64, x16 += 4, y16 += 4, z16 += 4;
        }

        // Handle multiples of 16 bytes
        while (bytes >= 16)
        {
            // z[i] = x[i] xor y[i]
            vst1q_u8((uint8_t*)z16,
                     veorq_u8(
                         vld1q_u8((uint8_t*)x16),
                         vld1q_u8((uint8_t*)y16)));

            bytes -= 16, ++x16, ++y16, ++z16;
        }
    }
    else
# endif // GF256_TRY_NEON
    {
        uint64_t * GF256_RESTRICT z8 = reinterpret_cast<uint64_t *>(z16);
        const uint64_t * GF256_RESTRICT x8 = reinterpret_cast<const uint64_t *>(x16);
        const uint64_t * GF256_RESTRICT y8 = reinterpret_cast<const uint64_t *>(y16);

        const unsigned count = (unsigned)bytes / 8;
        for (unsigned ii = 0; ii < count; ++ii)
            z8[ii] = x8[ii] ^ y8[ii];

        x16 = reinterpret_cast<const GF256_M128 *>(x8 + count);
        y16 = reinterpret_cast<const GF256_M128 *>(y8 + count);
        z16 = reinterpret_cast<GF256_M128 *>(z8 + count);

        bytes -= (count * 8);
    }
#else // GF256_TARGET_MOBILE
# if defined(GF256_TRY_AVX2)
    if (CpuHasAVX2)
    {
        GF256_M256 * GF256_RESTRICT z32 = reinterpret_cast<GF256_M256 *>(z16);
        const GF256_M256 * GF256_RESTRICT x32 = reinterpret_cast<const GF256_M256 *>(x16);
        const GF256_M256 * GF256_RESTRICT y32 = reinterpret_cast<const GF256_M256 *>(y16);

        const unsigned count = bytes / 32;
        for (unsigned i = 0; i < count; ++i)
        {
            _mm256_storeu_si256(z32 + i,
                _mm256_xor_si256(
                    _mm256_loadu_si256(x32 + i),
                    _mm256_loadu_si256(y32 + i)));
        }

        bytes -= count * 32;
        z16 = reinterpret_cast<GF256_M128 *>(z32 + count);
        x16 = reinterpret_cast<const GF256_M128 *>(x32 + count);
        y16 = reinterpret_cast<const GF256_M128 *>(y32 + count);
    }
    else
# endif // GF256_TRY_AVX2
    {
        // Handle multiples of 64 bytes
        while (bytes >= 64)
        {
            GF256_M128 x0 = _mm_loadu_si128(x16);
            GF256_M128 x1 = _mm_loadu_si128(x16 + 1);
            GF256_M128 x2 = _mm_loadu_si128(x16 + 2);
            GF256_M128 x3 = _mm_loadu_si128(x16 + 3);
            GF256_M128 y0 = _mm_loadu_si128(y16);
            GF256_M128 y1 = _mm_loadu_si128(y16 + 1);
            GF256_M128 y2 = _mm_loadu_si128(y16 + 2);
            GF256_M128 y3 = _mm_loadu_si128(y16 + 3);

            _mm_storeu_si128(z16,     _mm_xor_si128(x0, y0));
            _mm_storeu_si128(z16 + 1, _mm_xor_si128(x1, y1));
            _mm_storeu_si128(z16 + 2, _mm_xor_si128(x2, y2));
            _mm_storeu_si128(z16 + 3, _mm_xor_si128(x3, y3));

            bytes -= 64, x16 += 4, y16 += 4, z16 += 4;
        }
    }

    // Handle multiples of 16 bytes
    while (bytes >= 16)
    {
        // z[i] = x[i] xor y[i]
        _mm_storeu_si128(z16,
            _mm_xor_si128(
                _mm_loadu_si128(x16),
                _mm_loadu_si128(y16)));

        bytes -= 16, ++x16, ++y16, ++z16;
    }
#endif // GF256_TARGET_MOBILE

    uint8_t * GF256_RESTRICT z1 = reinterpret_cast<uint8_t *>(z16);
    const uint8_t * GF256_RESTRICT x1 = reinterpret_cast<const uint8_t *>(x16);
    const uint8_t * GF256_RESTRICT y1 = reinterpret_cast<const uint8_t *>(y16);

    // Handle a block of 8 bytes
    const int eight = bytes & 8;
    if (eight)
    {
        uint64_t * GF256_RESTRICT z8 = reinterpret_cast<uint64_t *>(z1);
        const uint64_t * GF256_RESTRICT x8 = reinterpret_cast<const uint64_t *>(x1);
        const uint64_t * GF256_RESTRICT y8 = reinterpret_cast<const uint64_t *>(y1);
        *z8 = *x8 ^ *y8;
    }

    // Handle a block of 4 bytes
    const int four = bytes & 4;
    if (four)
    {
        uint32_t * GF256_RESTRICT z4 = reinterpret_cast<uint32_t *>(z1 + eight);
        const uint32_t * GF256_RESTRICT x4 = reinterpret_cast<const uint32_t *>(x1 + eight);
        const uint32_t * GF256_RESTRICT y4 = reinterpret_cast<const uint32_t *>(y1 + eight);
        *z4 = *x4 ^ *y4;
    }

    // Handle final bytes
    const int offset = eight + four;
    switch (bytes & 3)
    {
    case 3: z1[offset + 2] = x1[offset + 2] ^ y1[offset + 2];
    case 2: z1[offset + 1] = x1[offset + 1] ^ y1[offset + 1];
    case 1: z1[offset] = x1[offset] ^ y1[offset];
    default:
        break;
    }
}